

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O1

Orphan<capnp::Text> * __thiscall
capnp::_::anon_unknown_0::PrefixAdder::decode
          (Orphan<capnp::Text> *__return_storage_ptr__,PrefixAdder *this,JsonCodec *codec,
          Reader input,Orphanage orphanage)

{
  PointerReader local_40;
  
  if (input._reader.pointerCount == 0) {
    input._reader.nestingLimit = 0x7fffffff;
    input._reader.capTable = (CapTableReader *)0x0;
    input._reader.pointers = (WirePointer *)0x0;
    input._reader.segment = (SegmentReader *)0x0;
  }
  local_40.segment = input._reader.segment;
  local_40.capTable = input._reader.capTable;
  local_40.pointer = input._reader.pointers;
  local_40.nestingLimit = input._reader.nestingLimit;
  PointerReader::getBlob<capnp::Text>(&local_40,(void *)0x0,0);
  OrphanBuilder::copy((EVP_PKEY_CTX *)&local_40,(EVP_PKEY_CTX *)orphanage.arena);
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_40.capTable;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_40.pointer;
  (__return_storage_ptr__->builder).location =
       (word *)CONCAT44(local_40._28_4_,local_40.nestingLimit);
  (__return_storage_ptr__->builder).tag.content = (uint64_t)local_40.segment;
  return __return_storage_ptr__;
}

Assistant:

Orphan<capnp::Text> decode(const JsonCodec& codec, JsonValue::Reader input,
                             Orphanage orphanage) const override {
    return orphanage.newOrphanCopy(capnp::Text::Reader(input.getString().slice(11)));
  }